

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<long,int,int(*)(char_const**,long*)>
               (int num1,_func_int_char_ptr_ptr_long_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  code *pcVar11;
  char (*pacVar12) [16];
  char (*pacVar13) [16];
  double dVar14;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  undefined8 *puVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  char *pcVar25;
  undefined1 *puVar26;
  uint *val;
  char *pcVar27;
  undefined8 *puVar28;
  char *pcVar29;
  char *unaff_R14;
  byte *__maxlen;
  undefined1 *puVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1088;
  undefined1 *puStack_1080;
  char acStack_1078 [256];
  undefined1 uStack_f78;
  undefined8 uStack_f77;
  undefined1 auStack_f6f [247];
  undefined8 *puStack_e78;
  byte *pbStack_e70;
  code *pcStack_e68;
  double dStack_e58;
  undefined8 *puStack_e50;
  char (*pacStack_e48) [16];
  char acStack_e40 [256];
  byte bStack_d40;
  undefined1 auStack_d3f [2];
  undefined1 auStack_d3d [6];
  undefined8 uStack_d37;
  undefined8 uStack_d2f;
  long lStack_c38;
  ulong uStack_c30;
  char *pcStack_c28;
  char *pcStack_c20;
  char *pcStack_c18;
  code *pcStack_c10;
  char (*pacStack_c08) [16];
  char *pcStack_c00;
  float fStack_bf8;
  undefined4 uStack_bf4;
  double dStack_bf0;
  double dStack_be8;
  char (*pacStack_be0) [16];
  char acStack_bd8 [256];
  byte bStack_ad8;
  undefined8 uStack_ad7;
  char acStack_acf [255];
  long lStack_9d0;
  ulong uStack_9c8;
  char *pcStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  code *pcStack_9a8;
  char (*pacStack_9a0) [16];
  char *pcStack_998;
  float fStack_990;
  undefined4 uStack_98c;
  double dStack_988;
  double dStack_980;
  code *pcStack_978;
  byte bStack_970;
  undefined8 uStack_96f;
  char acStack_967 [247];
  char acStack_870 [256];
  undefined1 auStack_770 [8];
  undefined8 *puStack_768;
  ulong uStack_760;
  undefined8 *puStack_758;
  long lStack_750;
  undefined1 *puStack_748;
  code *pcStack_740;
  code *pcStack_738;
  float fStack_72c;
  double dStack_728;
  double dStack_720;
  undefined8 *puStack_718;
  char (*pacStack_710) [16];
  byte bStack_708;
  undefined1 auStack_707 [2];
  undefined1 auStack_705 [6];
  undefined8 auStack_6ff [30];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  char (*pacStack_500) [16];
  char *pcStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  code *pcStack_4d8;
  float fStack_4c8;
  undefined4 uStack_4c4;
  char *pcStack_4c0;
  char *pcStack_4b8;
  double dStack_4b0;
  double dStack_4a8;
  char acStack_4a0 [9];
  char acStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  ulong uStack_298;
  ulong uStack_290;
  char *pcStack_288;
  char *pcStack_280;
  undefined1 *puStack_278;
  code *pcStack_270;
  int local_25c;
  ulong local_258;
  float local_24c;
  double local_248;
  undefined1 *local_240;
  byte local_238;
  undefined8 local_237;
  undefined1 local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  local_258 = (ulong)num1;
  if (num1 < 0) {
    pcVar15 = "%lld";
    uVar23 = local_258;
  }
  else {
    pcVar15 = "%llu";
    uVar23 = (ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x130463;
  local_25c = num1;
  iVar3 = snprintf(local_138 + 0xe,0xf2,pcVar15,uVar23);
  pcVar15 = local_138 + 0xe + iVar3;
  iVar4 = 0;
  pcStack_270 = (code *)0x130481;
  iVar3 = snprintf(pcVar15,(size_t)(local_38 + -(long)pcVar15)," into ");
  pcStack_270 = (code *)0x1304a0;
  snprintf(pcVar15 + iVar3,(size_t)(local_38 + -(long)(pcVar15 + iVar3)),"int%zu_t",0x40);
  pcStack_270 = (code *)0x1304af;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x1304c8;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x1304d8;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x1304e5;
  fputc(10,_stdout);
  if (-1 < local_25c) {
    pcStack_270 = (code *)0x1304f9;
    iVar4 = test_encode_uint_all_sizes((char (*) [16])&local_238,(ulong)(uint)num1);
  }
  uVar23 = local_258;
  pcVar15 = (char *)(&local_238 + (long)iVar4 * 0x10);
  pcStack_270 = (code *)0x13051a;
  iVar3 = test_encode_int_all_sizes((char (*) [16])pcVar15,local_258);
  uVar18 = iVar4 + iVar3;
  if (uVar18 != 0 && SCARRY4(iVar4,iVar3) == (int)uVar18 < 0) {
    local_24c = (float)local_25c;
    local_248 = (double)local_25c;
    uVar22 = (ulong)uVar18;
    puVar30 = (undefined1 *)((long)&local_237 + 1);
    pcVar29 = (char *)0x0;
    do {
      lVar6 = (long)pcVar29 * 0x10;
      bVar1 = puVar30[-2];
      uVar16 = (ulong)bVar1;
      uVar19 = (ulong)(char)bVar1;
      mVar2 = mp_type_hint[uVar16];
      puVar26 = puVar30;
      if (mVar2 != MP_UINT) {
        if (mVar2 == MP_FLOAT) {
          if (bVar1 != 0xca) goto LAB_00130873;
          uVar18 = *(uint *)(puVar30 + -1);
          fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                          uVar18 << 0x18);
          if ((fVar10 != local_24c) || (NAN(fVar10) || NAN(local_24c))) {
            pcStack_270 = (code *)0x130897;
            test_read_num<long,int,int(*)(char_const**,long*)>();
            goto LAB_00130897;
          }
          puVar26 = puVar30 + 3;
          goto LAB_001306c7;
        }
        if (mVar2 == MP_INT) {
          val = &switchD_0013059d::switchdataD_00139b0c;
          switch(bVar1) {
          case 0xd0:
            uVar16 = (ulong)(char)puVar30[-1];
            break;
          case 0xd1:
            uVar16 = (ulong)(short)(*(ushort *)(puVar30 + -1) << 8 | *(ushort *)(puVar30 + -1) >> 8)
            ;
            puVar26 = local_22f + lVar6 + -6;
            break;
          case 0xd2:
            uVar18 = *(uint *)(puVar30 + -1);
            uVar16 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8
                                 | uVar18 << 0x18);
            puVar26 = local_22f + lVar6 + -4;
            break;
          case 0xd3:
            uVar16 = *(ulong *)(puVar30 + -1);
            uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                     (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                     (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                     (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
            puVar26 = local_22f + lVar6;
            break;
          default:
            if (bVar1 < 0xe0) {
              pcStack_270 = (code *)0x13085f;
              test_read_num<long,int,int(*)(char_const**,long*)>();
              goto LAB_0013085f;
            }
            uVar16 = uVar19;
            puVar26 = local_22f + lVar6 + -8;
            val = (uint *)pcVar15;
          }
          if (uVar16 == uVar23) goto LAB_001306c7;
          pcStack_270 = (code *)0x1308bb;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_001308bb;
        }
        if (bVar1 != 0xcb) {
LAB_00130897:
          pcStack_270 = (code *)0x1308b6;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        uVar23 = *(ulong *)(puVar30 + -1);
        dVar14 = (double)(uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                          (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                          (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                          (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38);
        if ((dVar14 == local_248) && (!NAN(dVar14) && !NAN(local_248))) {
          puVar26 = local_22f + lVar6;
          goto LAB_001306c7;
        }
        goto LAB_0013086e;
      }
      val = &switchD_001305fc::switchdataD_00139afc;
      switch(bVar1) {
      case 0xcc:
        uVar16 = (ulong)(byte)puVar30[-1];
        break;
      case 0xcd:
        uVar16 = (ulong)(ushort)(*(ushort *)(puVar30 + -1) << 8 | *(ushort *)(puVar30 + -1) >> 8);
        puVar26 = local_22f + lVar6 + -6;
        break;
      case 0xce:
        uVar18 = *(uint *)(puVar30 + -1);
        uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        puVar26 = local_22f + lVar6 + -4;
        break;
      case 0xcf:
        uVar16 = *(ulong *)(puVar30 + -1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        puVar26 = local_22f + lVar6;
        break;
      default:
        if (-1 < (char)bVar1) {
          puVar26 = local_22f + lVar6 + -8;
          val = (uint *)pcVar15;
          break;
        }
LAB_0013085f:
        pcStack_270 = (code *)0x130864;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00130864;
      }
      if (uVar16 != uVar23) {
LAB_001308bb:
        uVar24 = SUB84(puVar26,0);
        pcStack_270 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        builtin_strncpy(acStack_3a0,"typed read of ",0xf);
        pcStack_4d8 = (code *)0x130920;
        uStack_4c4 = uVar24;
        uStack_298 = uVar19;
        uStack_290 = uVar23;
        pcStack_288 = pcVar29;
        pcStack_280 = unaff_R14;
        puStack_278 = puVar30;
        pcStack_270 = (code *)uVar22;
        iVar3 = snprintf(acStack_3a0 + 0xe,0xf2,"%llu",val);
        pcVar15 = acStack_3a0 + (long)iVar3 + 0xe;
        pcStack_4d8 = (code *)0x130944;
        iVar3 = snprintf(pcVar15,(size_t)(auStack_2a0 + -(long)pcVar15)," into ");
        pcStack_4d8 = (code *)0x130963;
        snprintf(pcVar15 + iVar3,(size_t)(auStack_2a0 + -(long)(pcVar15 + iVar3)),"int%zu_t",0x40);
        pcStack_4d8 = (code *)0x130972;
        _space((FILE *)_stdout);
        pcStack_4d8 = (code *)0x13098b;
        fwrite("# ",2,1,_stdout);
        pcStack_4d8 = (code *)0x13099b;
        fputs(acStack_3a0,_stdout);
        pcStack_4d8 = (code *)0x1309a8;
        fputc(10,_stdout);
        pcStack_4d8 = (code *)0x1309b5;
        pcVar15 = (char *)val;
        uVar18 = test_encode_uint_all_sizes((char (*) [16])acStack_4a0,(uint64_t)val);
        if (-1 < (long)val) {
          pcVar15 = (char *)0x7fffffffffffffff;
          pcStack_4d8 = (code *)0x1309e0;
          iVar3 = test_encode_int_all_sizes
                            ((char (*) [16])(acStack_4a0 + (long)(int)uVar18 * 0x10),
                             0x7fffffffffffffff);
          uVar18 = uVar18 + iVar3;
        }
        if ((int)uVar18 < 1) {
          return;
        }
        fStack_4c8 = (float)val;
        auVar32._8_4_ = (int)((ulong)val >> 0x20);
        auVar32._0_8_ = val;
        auVar32._12_4_ = 0x45300000;
        dStack_4a8 = auVar32._8_8_ - 1.9342813113834067e+25;
        dStack_4b0 = dStack_4a8 + ((double)CONCAT44(0x43300000,(int)val) - 4503599627370496.0);
        uVar23 = (ulong)uVar18;
        pcVar25 = acStack_4a0 + 2;
        pcVar20 = (char *)0x0;
        pcStack_4c0 = (char *)val;
        goto LAB_00130a52;
      }
LAB_001306c7:
      puVar7 = puVar30 + -2;
      local_240 = puVar26;
      switch(bVar1) {
      case 0xcc:
        uVar19 = (ulong)(byte)puVar30[-1];
        goto LAB_00130702;
      case 0xcd:
        puVar7 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(ushort)(*(ushort *)(puVar30 + -1) << 8 | *(ushort *)(puVar30 + -1) >> 8);
        break;
      case 0xce:
        uVar18 = *(uint *)(puVar30 + -1);
        uVar19 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        puVar7 = local_22f + lVar6 + -4;
        break;
      case 0xcf:
        uVar23 = *(ulong *)(puVar30 + -1);
        uVar19 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
        if (-1 < (long)uVar19) goto LAB_0013072c;
LAB_0013083f:
        uVar19 = 0;
        iVar3 = 0;
        goto LAB_0013077a;
      case 0xd0:
        uVar19 = (ulong)(char)puVar30[-1];
LAB_00130702:
        puVar7 = local_22f + lVar6 + -7;
        break;
      case 0xd1:
        puVar7 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(short)(*(ushort *)(puVar30 + -1) << 8 | *(ushort *)(puVar30 + -1) >> 8);
        break;
      case 0xd2:
        uVar18 = *(uint *)(puVar30 + -1);
        puVar7 = local_22f + lVar6 + -4;
        uVar19 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                             uVar18 << 0x18);
        break;
      case 0xd3:
        uVar23 = *(ulong *)(puVar30 + -1);
        uVar19 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                 (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                 (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                 (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
LAB_0013072c:
        puVar7 = local_22f + lVar6;
        break;
      default:
        if ((char)bVar1 < -0x20) goto LAB_0013083f;
        puVar7 = local_22f + lVar6 + -8;
      }
      iVar3 = 1;
LAB_0013077a:
      unaff_R14 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      pcStack_270 = (code *)0x13079e;
      _ok(iVar3,"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
      pcStack_270 = (code *)0x1307c6;
      _ok((uint)(local_240 == puVar7),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      uVar23 = local_258;
      if (local_25c < 0) {
        if (-1 < (long)uVar19) goto LAB_00130869;
        pcVar25 = "(int64_t)num1 == (int64_t)num2";
        iVar3 = 0x746;
      }
      else {
        if ((long)uVar19 < 0) {
LAB_00130864:
          pcStack_270 = (code *)0x130869;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130869:
          pcStack_270 = (code *)0x13086e;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013086e:
          pcStack_270 = (code *)0x130873;
          test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130873:
          pcStack_270 = (code *)0x130892;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        pcVar25 = "(uint64_t)num1 == (uint64_t)num2";
        iVar3 = 0x743;
      }
      pcVar15 = (char *)(ulong)(uVar19 == local_258);
      pcStack_270 = (code *)0x13082d;
      _ok((uint)(uVar19 == local_258),pcVar25,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar3,"check int number");
      pcVar29 = pcVar29 + 1;
      puVar30 = puVar30 + 0x10;
      uVar22 = uVar22 - 1;
    } while (uVar22 != 0);
  }
  return;
LAB_00130a52:
  lVar6 = (long)pcVar20 * 0x10;
  bVar1 = pcVar25[-2];
  pcVar17 = (char *)(ulong)bVar1;
  pcVar27 = (char *)(long)(char)bVar1;
  mVar2 = mp_type_hint[(long)pcVar17];
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pcVar17 = (char *)(ulong)(byte)pcVar25[-1];
      pcVar15 = pcVar25;
      break;
    case 0xcd:
      pcVar17 = (char *)(ulong)(ushort)(*(ushort *)(pcVar25 + -1) << 8 |
                                       *(ushort *)(pcVar25 + -1) >> 8);
      pcVar15 = acStack_4a0 + lVar6 + 3;
      break;
    case 0xce:
      uVar18 = *(uint *)(pcVar25 + -1);
      pcVar17 = (char *)(ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                               uVar18 << 0x18);
      pcVar15 = acStack_497 + lVar6 + -4;
      break;
    case 0xcf:
      uVar22 = *(ulong *)(pcVar25 + -1);
      pcVar17 = (char *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                         (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                         (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                         (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      pcVar15 = acStack_497 + lVar6;
      break;
    default:
      if (-1 < (char)bVar1) {
        pcVar15 = acStack_4a0 + lVar6 + 1;
        break;
      }
LAB_00130db7:
      pcStack_4d8 = (code *)0x130dbc;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130dbc;
    }
    if ((uint *)pcVar17 != val) {
LAB_00130e0e:
      pcStack_4d8 = test_read_num<double,int,int(*)(char_const**,double*)>;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      pcStack_4e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      iVar3 = (int)val;
      builtin_strncpy(acStack_608,"typed read of ",0xf);
      pcStack_738 = (code *)(long)iVar3;
      if (iVar3 < 0) {
        pcVar17 = "%lld";
        pcVar11 = pcStack_738;
      }
      else {
        pcVar17 = "%llu";
        pcVar11 = (code *)((ulong)val & 0xffffffff);
      }
      pcStack_740 = (code *)0x130e95;
      pacStack_710 = (char (*) [16])pcVar15;
      pacStack_500 = (char (*) [16])pcVar20;
      pcStack_4f8 = pcVar25;
      pcStack_4f0 = pcVar29;
      pcStack_4e0 = acStack_4a0 + lVar6;
      pcStack_4d8 = (code *)uVar23;
      iVar4 = snprintf(acStack_608 + 0xe,0xf2,pcVar17,pcVar11);
      pcVar15 = acStack_608 + 0xe + iVar4;
      iVar5 = 0;
      pcStack_740 = (code *)0x130eb4;
      iVar4 = snprintf(pcVar15,(size_t)(auStack_508 + -(long)pcVar15)," into ");
      puVar30 = auStack_508 + -(long)(pcVar15 + iVar4);
      pcStack_740 = (code *)0x130ece;
      snprintf(pcVar15 + iVar4,(size_t)puVar30,"double");
      pcStack_740 = (code *)0x130edd;
      _space((FILE *)_stdout);
      pcStack_740 = (code *)0x130ef6;
      fwrite("# ",2,1,_stdout);
      pcStack_740 = (code *)0x130f06;
      fputs(acStack_608,_stdout);
      pcStack_740 = (code *)0x130f13;
      fputc(10,_stdout);
      if (-1 < iVar3) {
        pcStack_740 = (code *)0x130f24;
        iVar5 = test_encode_uint_all_sizes
                          ((char (*) [16])&bStack_708,(uint64_t)((ulong)val & 0xffffffff));
      }
      pcVar29 = (char *)(&bStack_708 + (long)iVar5 * 0x10);
      pcStack_740 = (code *)0x130f42;
      pcVar15 = (char *)pcStack_738;
      iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar29,(int64_t)pcStack_738);
      uVar18 = iVar5 + iVar4;
      if (uVar18 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar18 < 0) {
        return;
      }
      fStack_72c = (float)iVar3;
      dStack_728 = (double)iVar3;
      uVar23 = (ulong)uVar18;
      puVar28 = (undefined8 *)(auStack_707 + 1);
      pcVar25 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      lVar6 = 0;
      goto LAB_00130f73;
    }
  }
  else {
    if (mVar2 == MP_FLOAT) {
      if (bVar1 != 0xca) {
LAB_00130de5:
        pcStack_4d8 = (code *)0x130e04;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar18 = *(uint *)(pcVar25 + -1);
      fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      if ((fVar10 == fStack_4c8) && (!NAN(fVar10) && !NAN(fStack_4c8))) {
        pcVar15 = pcVar25 + 3;
        goto LAB_00130bdc;
      }
      pcStack_4d8 = (code *)0x130e09;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
      pcStack_4d8 = (code *)0x130e0e;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130e0e;
    }
    if (mVar2 == MP_INT) {
      switch(bVar1) {
      case 0xd0:
        pcVar17 = (char *)(long)pcVar25[-1];
        pcVar15 = pcVar25;
        break;
      case 0xd1:
        pcVar17 = (char *)(long)(short)(*(ushort *)(pcVar25 + -1) << 8 |
                                       *(ushort *)(pcVar25 + -1) >> 8);
        pcVar15 = acStack_4a0 + lVar6 + 3;
        break;
      case 0xd2:
        uVar18 = *(uint *)(pcVar25 + -1);
        pcVar17 = (char *)(long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                      (uVar18 & 0xff00) << 8 | uVar18 << 0x18);
        pcVar15 = acStack_497 + lVar6 + -4;
        break;
      case 0xd3:
        uVar22 = *(ulong *)(pcVar25 + -1);
        pcVar17 = (char *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                           (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                           (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                           (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
        pcVar15 = acStack_497 + lVar6;
        break;
      default:
        if (bVar1 < 0xe0) {
          pcStack_4d8 = (code *)0x130db7;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130db7;
        }
        pcVar17 = pcVar27;
        pcVar15 = acStack_4a0 + lVar6 + 1;
      }
      if ((uint *)pcVar17 != val) goto LAB_00130e09;
    }
    else {
      if (bVar1 != 0xcb) goto LAB_00130dc1;
      uVar22 = *(ulong *)(pcVar25 + -1);
      dVar14 = (double)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                        (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                        (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                        (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      if ((dVar14 != dStack_4b0) || (NAN(dVar14) || NAN(dStack_4b0))) {
        pcStack_4d8 = (code *)0x130de5;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_00130de5;
      }
      pcVar15 = acStack_497 + lVar6;
    }
  }
LAB_00130bdc:
  pcVar29 = pcVar25 + -2;
  switch(bVar1) {
  case 0xcc:
    pcVar27 = (char *)(ulong)(byte)pcVar25[-1];
    goto LAB_00130c11;
  case 0xcd:
    pcVar17 = acStack_4a0 + lVar6 + 3;
    pcVar27 = (char *)(ulong)(ushort)(*(ushort *)(pcVar25 + -1) << 8 |
                                     *(ushort *)(pcVar25 + -1) >> 8);
    break;
  case 0xce:
    uVar18 = *(uint *)(pcVar25 + -1);
    pcVar27 = (char *)(ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                             uVar18 << 0x18);
    pcVar17 = acStack_497 + lVar6 + -4;
    break;
  case 0xcf:
    uVar22 = *(ulong *)(pcVar25 + -1);
    pcVar27 = (char *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                       (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                       (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                       (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
    if (-1 < (long)pcVar27) goto LAB_00130c3f;
LAB_00130d8e:
    pcVar27 = (char *)0x0;
    iVar4 = 1;
    iVar3 = 0;
    pcVar17 = pcVar29;
    goto LAB_00130c91;
  case 0xd0:
    pcVar27 = (char *)(long)pcVar25[-1];
LAB_00130c11:
    pcVar17 = acStack_4a0 + lVar6 + 2;
    break;
  case 0xd1:
    pcVar17 = acStack_4a0 + lVar6 + 3;
    pcVar27 = (char *)(long)(short)(*(ushort *)(pcVar25 + -1) << 8 | *(ushort *)(pcVar25 + -1) >> 8)
    ;
    break;
  case 0xd2:
    uVar18 = *(uint *)(pcVar25 + -1);
    pcVar17 = acStack_497 + lVar6 + -4;
    pcVar27 = (char *)(long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8
                                 | uVar18 << 0x18);
    break;
  case 0xd3:
    uVar22 = *(ulong *)(pcVar25 + -1);
    pcVar27 = (char *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                       (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                       (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                       (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
LAB_00130c3f:
    pcVar17 = acStack_497 + lVar6;
    break;
  default:
    if ((char)bVar1 < -0x20) goto LAB_00130d8e;
    pcVar17 = acStack_4a0 + lVar6 + 1;
  }
  iVar3 = 1;
  iVar4 = 0;
LAB_00130c91:
  if ((char)uStack_4c4 == '\0') {
    pcStack_4d8 = (code *)0x130d51;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    pcVar15 = "mp_num_pos2 == mp_nums[i]";
    pcStack_4d8 = (code *)0x130d77;
    _ok((uint)(pcVar29 == pcVar17),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    val = (uint *)pcStack_4c0;
  }
  else {
    pcStack_4d8 = (code *)0x130ccd;
    pcStack_4b8 = pcVar25;
    _ok(iVar3,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    pcStack_4d8 = (code *)0x130cf3;
    _ok((uint)(pcVar15 == pcVar17),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    val = (uint *)pcStack_4c0;
    if ((long)pcVar27 < 0) {
LAB_00130dbc:
      pcStack_4d8 = (code *)0x130dc1;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
      pcStack_4d8 = (code *)0x130de0;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pcVar15 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_4d8 = (code *)0x130d27;
    _ok((uint)(pcVar27 == pcStack_4c0),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar25 = pcStack_4b8;
    pcVar29 = pcVar20;
  }
  pcVar20 = pcVar20 + 1;
  pcVar25 = pcVar25 + 0x10;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00130a52;
LAB_00130f73:
  lVar8 = lVar6 * 0x10;
  bVar1 = *(byte *)((long)puVar28 + -2);
  pcVar11 = (code *)(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pcVar11];
  puVar21 = puVar28;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pcVar11 = (code *)(ulong)*(byte *)((long)puVar28 + -1);
      break;
    case 0xcd:
      pcVar11 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar28 + -1) << 8 |
                                       *(ushort *)((long)puVar28 + -1) >> 8);
      puVar21 = (undefined8 *)((long)auStack_6ff + lVar8 + -6);
      break;
    case 0xce:
      uVar18 = *(uint *)((long)puVar28 + -1);
      pcVar11 = (code *)(ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                               uVar18 << 0x18);
      puVar21 = (undefined8 *)((long)auStack_6ff + lVar8 + -4);
      break;
    case 0xcf:
      uVar22 = *(ulong *)((long)puVar28 + -1);
      pcVar11 = (code *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                         (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                         (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                         (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      puVar21 = auStack_6ff + lVar6 * 2;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_001311cd:
        pcStack_740 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_740 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_740 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar21 = auStack_6ff + lVar6 * 2 + -1;
    }
    if (pcVar11 != pcStack_738) {
      pcStack_740 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_740 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_740 = (code *)0x139f88;
      builtin_strncpy(acStack_870,"typed read of ",0xf);
      pcStack_9a8 = (code *)0x13128b;
      uStack_98c = extraout_EDX;
      pcStack_978 = (code *)pcVar15;
      puStack_768 = puVar21;
      uStack_760 = uVar23;
      puStack_758 = puVar28;
      lStack_750 = lVar6;
      puStack_748 = puVar30;
      iVar3 = snprintf(acStack_870 + 0xe,0xf2,"%llu",pcVar29);
      pcVar15 = acStack_870 + (long)iVar3 + 0xe;
      pcStack_9a8 = (code *)0x1312af;
      iVar3 = snprintf(pcVar15,(size_t)(auStack_770 + -(long)pcVar15)," into ");
      pcStack_9a8 = (code *)0x1312c9;
      snprintf(pcVar15 + iVar3,(size_t)(auStack_770 + -(long)(pcVar15 + iVar3)),"double");
      pcStack_9a8 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_9a8 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_9a8 = (code *)0x131301;
      fputs(acStack_870,_stdout);
      pcStack_9a8 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_9a8 = (code *)0x13131b;
      iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_970,(uint64_t)pcVar29);
      pacVar13 = (char (*) [16])(&bStack_970 + (long)iVar3 * 0x10);
      pcStack_9a8 = (code *)0x131339;
      pacStack_9a0 = (char (*) [16])pcVar29;
      iVar4 = test_encode_int_all_sizes(pacVar13,(int64_t)pcVar29);
      uVar18 = iVar3 + iVar4;
      if (uVar18 == 0 || SCARRY4(iVar3,iVar4) != (int)uVar18 < 0) {
        return;
      }
      fStack_990 = (float)(long)pacStack_9a0;
      dStack_988 = (double)(long)pacStack_9a0;
      uVar23 = (ulong)uVar18;
      pcVar20 = (char *)((long)&uStack_96f + 1);
      lVar6 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_001311fb:
      pcStack_740 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)((long)puVar28 + -1);
    fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar10 != fStack_72c) || (NAN(fVar10) || NAN(fStack_72c))) goto LAB_001311d2;
    puVar21 = (undefined8 *)((long)puVar28 + 3);
  }
  else if (mVar2 == MP_INT) {
    pcVar11 = (code *)(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pcVar11 = (code *)(long)*(char *)((long)puVar28 + -1);
      pcVar15 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar11 = (code *)(long)(short)(*(ushort *)((long)puVar28 + -1) << 8 |
                                     *(ushort *)((long)puVar28 + -1) >> 8);
      puVar21 = (undefined8 *)((long)auStack_6ff + lVar8 + -6);
      pcVar15 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar18 = *(uint *)((long)puVar28 + -1);
      pcVar11 = (code *)(long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                    (uVar18 & 0xff00) << 8 | uVar18 << 0x18);
      puVar21 = (undefined8 *)((long)auStack_6ff + lVar8 + -4);
      pcVar15 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar22 = *(ulong *)((long)puVar28 + -1);
      pcVar11 = (code *)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                         (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                         (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                         (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      puVar21 = auStack_6ff + lVar6 * 2;
      pcVar15 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_740 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar21 = auStack_6ff + lVar6 * 2 + -1;
    }
    if (pcVar11 != pcStack_738) goto LAB_0013121f;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_001311d7;
    uVar22 = *(ulong *)((long)puVar28 + -1);
    dVar14 = (double)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                      (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                      (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                      (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
    if ((dVar14 != dStack_728) || (NAN(dVar14) || NAN(dStack_728))) {
      pcStack_740 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar21 = auStack_6ff + lVar6 * 2;
  }
  puStack_718 = (undefined8 *)((long)puVar28 + -2);
  puVar30 = (undefined1 *)(ulong)(uint)(int)(char)bVar1;
  dStack_720 = 0.0;
  pcStack_740 = (code *)0x131113;
  iVar3 = (*(code *)pacStack_710)(&puStack_718,&dStack_720);
  pcStack_740 = (code *)0x13113b;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar30);
  pcStack_740 = (code *)0x131163;
  _ok((uint)(puVar21 == puStack_718),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar31 = ABS(dStack_728 - dStack_720) < 1e-15;
  pcVar29 = (char *)(ulong)bVar31;
  pcVar15 = "double_eq(num1, num2)";
  pcStack_740 = (code *)0x1311a6;
  _ok((uint)bVar31,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar6 = lVar6 + 1;
  puVar28 = puVar28 + 2;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar8 = lVar6 * 0x10;
  bVar1 = pcVar20[-2];
  pacVar12 = (char (*) [16])(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pacVar12];
  pcVar17 = pcVar20;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pacVar12 = (char (*) [16])(ulong)(byte)pcVar20[-1];
      break;
    case 0xcd:
      pacVar12 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar20 + -1) << 8 | *(ushort *)(pcVar20 + -1) >> 8);
      pcVar17 = acStack_967 + lVar8 + -6;
      break;
    case 0xce:
      uVar18 = *(uint *)(pcVar20 + -1);
      pacVar12 = (char (*) [16])
                 (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
      pcVar17 = acStack_967 + lVar8 + -4;
      break;
    case 0xcf:
      uVar22 = *(ulong *)(pcVar20 + -1);
      pacVar12 = (char (*) [16])
                 (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                  (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                  (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                  (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      pcVar17 = acStack_967 + lVar6 * 0x10;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131627:
        pcStack_9a8 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_9a8 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_9a8 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar17 = acStack_967 + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar12 != pacStack_9a0) {
      pcStack_9a8 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_9a8 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_bd8,"typed read of ",0xf);
      pcStack_c10 = (code *)0x1316e2;
      uStack_bf4 = extraout_EDX_00;
      pacStack_be0 = (char (*) [16])pcVar29;
      lStack_9d0 = lVar6;
      uStack_9c8 = uVar23;
      pcStack_9c0 = pcVar15;
      pcStack_9b8 = pcVar17;
      pcStack_9b0 = pcVar20;
      pcStack_9a8 = (code *)pcVar25;
      iVar3 = snprintf(acStack_bd8 + 0xe,0xf2,"%lld",pacVar13);
      pcVar15 = acStack_bd8 + (long)iVar3 + 0xe;
      pcStack_c10 = (code *)0x131703;
      iVar3 = snprintf(pcVar15,(size_t)(&bStack_ad8 + -(long)pcVar15)," into ");
      pcStack_c10 = (code *)0x13171d;
      snprintf(pcVar15 + iVar3,(size_t)(&bStack_ad8 + -(long)(pcVar15 + iVar3)),"double");
      pcStack_c10 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_c10 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_c10 = (code *)0x131752;
      fputs(acStack_bd8,_stdout);
      pcStack_c10 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar12 = (char (*) [16])&bStack_ad8;
      pcStack_c10 = (code *)0x131773;
      pacStack_c08 = pacVar13;
      uVar18 = test_encode_int_all_sizes(pacVar12,(int64_t)pacVar13);
      if ((int)uVar18 < 1) {
        return;
      }
      fStack_bf8 = (float)(long)pacStack_c08;
      dStack_bf0 = (double)(long)pacStack_c08;
      uVar23 = (ulong)uVar18;
      pcVar29 = (char *)((long)&uStack_ad7 + 1);
      lVar6 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131655:
      pcStack_9a8 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)(pcVar20 + -1);
    fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar10 != fStack_990) || (NAN(fVar10) || NAN(fStack_990))) goto LAB_0013162c;
    pcVar17 = pcVar20 + 3;
  }
  else if (mVar2 == MP_INT) {
    pacVar12 = (char (*) [16])(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pacVar12 = (char (*) [16])(long)pcVar20[-1];
      pcVar29 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar12 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar20 + -1) << 8 | *(ushort *)(pcVar20 + -1) >> 8);
      pcVar29 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar17 = acStack_967 + lVar8 + -6;
      break;
    case 0xd2:
      uVar18 = *(uint *)(pcVar20 + -1);
      pacVar12 = (char (*) [16])
                 (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                            uVar18 << 0x18);
      pcVar29 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar17 = acStack_967 + lVar8 + -4;
      break;
    case 0xd3:
      uVar22 = *(ulong *)(pcVar20 + -1);
      pacVar12 = (char (*) [16])
                 (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                  (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                  (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                  (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      pcVar29 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar17 = acStack_967 + lVar6 * 0x10;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_9a8 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar17 = acStack_967 + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar12 != pacStack_9a0) goto LAB_00131679;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131631;
    uVar22 = *(ulong *)(pcVar20 + -1);
    dVar14 = (double)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                      (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                      (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                      (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
    if ((dVar14 != dStack_988) || (NAN(dVar14) || NAN(dStack_988))) {
      pcStack_9a8 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar17 = acStack_967 + lVar6 * 0x10;
  }
  pcVar25 = pcVar20 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar1;
  dStack_980 = 0.0;
  pcStack_9a8 = (code *)0x131508;
  pcStack_998 = pcVar25;
  iVar3 = (*pcStack_978)(&pcStack_998,&dStack_980);
  if ((char)uStack_98c == '\0') {
    pcStack_9a8 = (code *)0x1315d8;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar31 = pcVar25 == pcStack_998;
    pcVar29 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar17 = "check position";
  }
  else {
    pcVar25 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_9a8 = (code *)0x131542;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_9a8 = (code *)0x13156a;
    _ok((uint)(pcVar17 == pcStack_998),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar31 = ABS(dStack_988 - dStack_980) < 1e-15;
    pcVar29 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar17 = "check float number";
  }
  pacVar13 = (char (*) [16])(ulong)bVar31;
  pcStack_9a8 = (code *)0x131600;
  _ok((uint)bVar31,pcVar29,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar17);
  lVar6 = lVar6 + 1;
  pcVar20 = pcVar20 + 0x10;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar8 = lVar6 * 0x10;
  bVar1 = pcVar29[-2];
  pacVar13 = (char (*) [16])(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pacVar13];
  pcVar20 = pcVar29;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pacVar13 = (char (*) [16])(ulong)(byte)pcVar29[-1];
      break;
    case 0xcd:
      pacVar13 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar29 + -1) << 8 | *(ushort *)(pcVar29 + -1) >> 8);
      pcVar20 = acStack_acf + lVar8 + -6;
      break;
    case 0xce:
      uVar18 = *(uint *)(pcVar29 + -1);
      pacVar13 = (char (*) [16])
                 (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
      pcVar20 = acStack_acf + lVar8 + -4;
      break;
    case 0xcf:
      uVar22 = *(ulong *)(pcVar29 + -1);
      pacVar13 = (char (*) [16])
                 (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                  (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                  (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                  (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      pcVar20 = acStack_acf + lVar6 * 0x10;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131a67:
        pcStack_c10 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_c10 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_c10 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar20 = acStack_acf + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar13 != pacStack_c08) {
      pcStack_c10 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_c10 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e40,"typed read of ",0xf);
      pcStack_e68 = (code *)0x131b1e;
      pacStack_e48 = pacVar12;
      lStack_c38 = lVar6;
      uStack_c30 = uVar23;
      pcStack_c28 = pcVar15;
      pcStack_c20 = pcVar20;
      pcStack_c18 = pcVar29;
      pcStack_c10 = (code *)pcVar25;
      iVar3 = snprintf(acStack_e40 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar15 = acStack_e40 + (long)iVar3 + 0xe;
      pcStack_e68 = (code *)0x131b3f;
      iVar3 = snprintf(pcVar15,(size_t)(&bStack_d40 + -(long)pcVar15)," into ");
      __maxlen = &bStack_d40 + -(long)(pcVar15 + iVar3);
      pcStack_e68 = (code *)0x131b59;
      snprintf(pcVar15 + iVar3,(size_t)__maxlen,"double");
      pcStack_e68 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar8 = 1;
      pcStack_e68 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_e68 = (code *)0x131b94;
      fputs(acStack_e40,_stdout);
      pcVar11 = (code *)0xa;
      pcStack_e68 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar28 = (undefined8 *)(auStack_d3f + 1);
      bStack_d40 = 0xca;
      _auStack_d3f = 0x1059c84a;
      uStack_d37._7_1_ = 0xcb;
      uStack_d2f = 0x220b5941;
      lVar6 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131a95:
      pcStack_c10 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)(pcVar29 + -1);
    fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar10 != fStack_bf8) || (NAN(fVar10) || NAN(fStack_bf8))) goto LAB_00131a6c;
    pcVar20 = pcVar29 + 3;
  }
  else if (mVar2 == MP_INT) {
    pacVar13 = (char (*) [16])(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pacVar13 = (char (*) [16])(long)pcVar29[-1];
      break;
    case 0xd1:
      pacVar13 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar29 + -1) << 8 | *(ushort *)(pcVar29 + -1) >> 8);
      pcVar20 = acStack_acf + lVar8 + -6;
      break;
    case 0xd2:
      uVar18 = *(uint *)(pcVar29 + -1);
      pacVar13 = (char (*) [16])
                 (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                            uVar18 << 0x18);
      pcVar20 = acStack_acf + lVar8 + -4;
      break;
    case 0xd3:
      uVar22 = *(ulong *)(pcVar29 + -1);
      pacVar13 = (char (*) [16])
                 (uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                  (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                  (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                  (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
      pcVar20 = acStack_acf + lVar6 * 0x10;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_c10 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar20 = acStack_acf + (lVar6 * 2 + -1) * 8;
    }
    if (pacVar13 != pacStack_c08) goto LAB_00131ab9;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131a71;
    uVar22 = *(ulong *)(pcVar29 + -1);
    dVar14 = (double)(uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                      (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                      (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                      (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38);
    if ((dVar14 != dStack_bf0) || (NAN(dVar14) || NAN(dStack_bf0))) {
      pcStack_c10 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar20 = acStack_acf + lVar6 * 0x10;
  }
  pcVar25 = pcVar29 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar1;
  dStack_be8 = 0.0;
  pcStack_c10 = (code *)0x131948;
  pcStack_c00 = pcVar25;
  iVar3 = (*(code *)pacStack_be0)(&pcStack_c00,&dStack_be8);
  if ((char)uStack_bf4 == '\0') {
    pcStack_c10 = (code *)0x131a18;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar31 = pcVar25 == pcStack_c00;
    pcVar20 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar17 = "check position";
  }
  else {
    pcVar25 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_c10 = (code *)0x131982;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_c10 = (code *)0x1319aa;
    _ok((uint)(pcVar20 == pcStack_c00),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar31 = ABS(dStack_bf0 - dStack_be8) < 1e-15;
    pcVar20 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar17 = "check float number";
  }
  pacVar12 = (char (*) [16])(ulong)bVar31;
  pcStack_c10 = (code *)0x131a40;
  _ok((uint)bVar31,pcVar20,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar17);
  lVar6 = lVar6 + 1;
  pcVar29 = pcVar29 + 0x10;
  uVar23 = uVar23 - 1;
  if (uVar23 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar9 = lVar6 * 0x10;
  bVar1 = *(byte *)((long)puVar28 + -2);
  uVar23 = (ulong)bVar1;
  mVar2 = mp_type_hint[uVar23];
  puVar21 = puVar28;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      uVar23 = (ulong)*(byte *)((long)puVar28 + -1);
      break;
    case 0xcd:
      uVar23 = (ulong)(ushort)(*(ushort *)((long)puVar28 + -1) << 8 |
                              *(ushort *)((long)puVar28 + -1) >> 8);
      puVar21 = (undefined8 *)(auStack_d3d + lVar9);
      break;
    case 0xce:
      uVar18 = *(uint *)((long)puVar28 + -1);
      uVar23 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      puVar21 = (undefined8 *)(auStack_d3d + lVar9 + 2);
      break;
    case 0xcf:
      uVar23 = *(ulong *)((long)puVar28 + -1);
      uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
               (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
               (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28
               | uVar23 << 0x38;
      puVar21 = &uStack_d37 + lVar6 * 2;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131e46:
        pcStack_e68 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_e68 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_e68 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar21 = (undefined8 *)(auStack_d3f + lVar9);
    }
    if (uVar23 != 0x642c88) {
      pcStack_e68 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_e68 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1078,"typed read of ",0xf);
      puStack_e78 = puVar21;
      pbStack_e70 = __maxlen;
      pcStack_e68 = (code *)lVar8;
      iVar3 = snprintf(acStack_1078 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar15 = acStack_1078 + (long)iVar3 + 0xe;
      iVar3 = snprintf(pcVar15,(size_t)(&uStack_f78 + -(long)pcVar15)," into ");
      snprintf(pcVar15 + iVar3,(size_t)(&uStack_f78 + -(long)(pcVar15 + iVar3)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1078,_stdout);
      fputc(10,_stdout);
      uStack_f78 = 0xcb;
      uStack_f77 = 0xb81e85eb513816c0;
      puStack_1080 = &uStack_f78;
      dStack_1088 = 0.0;
      iVar3 = (*pcVar11)(&puStack_1080,&dStack_1088);
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_f6f == puStack_1080),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1088) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131e74:
      pcStack_e68 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)((long)puVar28 + -1);
    fVar10 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar10 != 6.565e+06) || (NAN(fVar10))) goto LAB_00131e4b;
    puVar21 = (undefined8 *)((long)puVar28 + 3);
  }
  else if (mVar2 == MP_INT) {
    uVar23 = (ulong)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      uVar23 = (ulong)*(char *)((long)puVar28 + -1);
      break;
    case 0xd1:
      uVar23 = (ulong)(short)(*(ushort *)((long)puVar28 + -1) << 8 |
                             *(ushort *)((long)puVar28 + -1) >> 8);
      puVar21 = (undefined8 *)(auStack_d3d + lVar9);
      break;
    case 0xd2:
      uVar18 = *(uint *)((long)puVar28 + -1);
      uVar23 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                           uVar18 << 0x18);
      puVar21 = (undefined8 *)(auStack_d3d + lVar9 + 2);
      break;
    case 0xd3:
      uVar23 = *(ulong *)((long)puVar28 + -1);
      uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
               (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
               (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28
               | uVar23 << 0x38;
      puVar21 = &uStack_d37 + lVar6 * 2;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_e68 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar21 = (undefined8 *)(auStack_d3f + lVar9);
    }
    if (uVar23 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131e50;
    uVar23 = *(ulong *)((long)puVar28 + -1);
    dVar14 = (double)(uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                      (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                      (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                      (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38);
    if ((dVar14 != 6565000.0) || (NAN(dVar14))) {
      pcStack_e68 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar21 = &uStack_d37 + lVar6 * 2;
  }
  puStack_e50 = (undefined8 *)((long)puVar28 + -2);
  __maxlen = (byte *)(ulong)(uint)(int)(char)bVar1;
  dStack_e58 = 0.0;
  pcStack_e68 = (code *)0x131d8a;
  iVar3 = (*(code *)pacStack_e48)(&puStack_e50,&dStack_e58);
  pcStack_e68 = (code *)0x131db2;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_e68 = (code *)0x131dda;
  _ok((uint)(puVar21 == puStack_e50),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar31 = ABS(6565000.0 - dStack_e58) < 1e-15;
  pcVar11 = (code *)(ulong)bVar31;
  pcStack_e68 = (code *)0x131e1f;
  _ok((uint)bVar31,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar6 = lVar6 + 1;
  puVar28 = puVar28 + 2;
  lVar8 = lVar8 + -1;
  if (lVar8 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}